

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O2

void TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::HighOrderFunctionsFilter
               (TPZVec<int> *firstHCurlFunc,TPZVec<int> *conOrders,TPZVec<int> *filteredFuncs)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  MElementType MVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ostream *poVar8;
  int *piVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int ifunc;
  int iVar19;
  int iVar20;
  ulong uVar21;
  bool bVar22;
  int local_5c;
  
  local_5c = 2;
  uVar2 = pztopology::TPZCube::NumSides(2);
  iVar3 = pztopology::TPZCube::NumSides(1);
  (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs,0);
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  uVar21 = 0;
  iVar18 = 0;
  do {
    if (uVar21 == uVar6) {
      iVar1 = conOrders->fStore[(int)(iVar3 + uVar2)];
      iVar3 = firstHCurlFunc->fStore[(int)(iVar3 + uVar2)];
      iVar19 = iVar1 * iVar1;
      (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs,(long)((iVar1 * 2 + 3) * iVar19 + iVar18));
      iVar13 = iVar19 * 6;
      piVar9 = filteredFuncs->fStore + iVar18;
      for (; iVar19 < iVar13; iVar19 = iVar19 + 1) {
        *piVar9 = iVar3 + iVar19;
        iVar18 = iVar18 + 1;
        piVar9 = piVar9 + 1;
      }
      iVar19 = iVar3 + iVar13;
      iVar20 = iVar1 + -1;
      iVar10 = iVar20 * iVar20 * 3;
      iVar17 = iVar10 * iVar20;
      piVar9 = filteredFuncs->fStore;
      uVar2 = 0;
      iVar15 = 0;
      iVar5 = iVar19;
      if (0 < iVar17) {
        iVar15 = iVar17;
      }
      while( true ) {
        if (iVar15 == 0) break;
        if ((uVar2 / 3) * 3 + local_5c != 0) {
          piVar9[iVar18] = iVar5;
          iVar18 = iVar18 + 1;
        }
        uVar2 = uVar2 + 1;
        local_5c = local_5c + -1;
        iVar15 = iVar15 + -1;
        iVar5 = iVar5 + 1;
      }
      iVar5 = (iVar1 * 2 + -1) * iVar20;
      iVar17 = iVar17 + iVar19;
      piVar9 = filteredFuncs->fStore;
      iVar19 = 0;
      if (0 < iVar5) {
        iVar19 = iVar5;
      }
      lVar7 = (long)iVar18 << 2;
      iVar18 = iVar19;
      while (bVar22 = iVar18 != 0, iVar18 = iVar18 + -1, bVar22) {
        *(int *)((long)piVar9 + lVar7) = iVar17;
        lVar7 = lVar7 + 4;
        iVar17 = iVar17 + 1;
      }
      piVar9 = filteredFuncs->fStore;
      for (lVar14 = 0; iVar19 != (int)lVar14; lVar14 = lVar14 + 1) {
        *(int *)((long)piVar9 + lVar14 * 4 + lVar7) =
             (iVar10 + iVar1 * 2 + -1) * iVar20 + iVar3 + iVar13 + (int)lVar14;
      }
      return;
    }
    lVar7 = (long)iVar3 + uVar21;
    iVar1 = firstHCurlFunc->fStore[lVar7];
    iVar13 = conOrders->fStore[lVar7];
    MVar4 = pztopology::TPZCube::Type((int)lVar7 + 8);
    if (MVar4 == EQuadrilateral) {
      (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs,(long)((iVar13 + 2) * iVar13 + iVar18));
      iVar5 = 0;
      iVar19 = iVar1;
      iVar10 = 0;
      if (0 < iVar13) {
        iVar10 = iVar13;
      }
      for (; iVar5 != 3; iVar5 = iVar5 + 1) {
        piVar9 = filteredFuncs->fStore;
        for (lVar7 = 0; iVar15 = (int)lVar7, iVar10 != iVar15; lVar7 = lVar7 + 1) {
          piVar9[iVar18 + lVar7] = iVar19 + iVar15;
        }
        iVar18 = iVar18 + iVar15;
        iVar19 = iVar19 + iVar13;
      }
      iVar19 = iVar13 + -1;
      uVar11 = iVar19 * iVar19 * 2;
      piVar9 = filteredFuncs->fStore;
      uVar16 = 0;
      uVar12 = 0;
      if (0 < (int)uVar11) {
        uVar12 = uVar11;
      }
      for (; uVar12 != uVar16; uVar16 = uVar16 + 1) {
        if ((uVar16 & 1) != 0) {
          piVar9[iVar18] = iVar1 + iVar13 * 4 + uVar16;
          iVar18 = iVar18 + 1;
        }
      }
      if (iVar19 < 1) {
        iVar19 = 0;
      }
      piVar9 = filteredFuncs->fStore;
      for (lVar7 = 0; iVar10 = (int)lVar7, iVar19 != iVar10; lVar7 = lVar7 + 1) {
        piVar9[iVar18 + lVar7] = iVar13 * 5 + iVar1 + uVar11 + -1 + iVar10;
      }
      iVar18 = iVar18 + iVar10;
    }
    else {
      if (MVar4 != ETriangle) {
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "static void TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::HighOrderFunctionsFilter(const TPZVec<int> &, const TPZVec<int> &, TPZVec<int> &) [TSHAPE = pzshape::TPZShapeCube]"
                                );
        poVar8 = std::operator<<(poVar8," error. Not yet implemented");
        std::endl<char,std::char_traits<char>>(poVar8);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurlNoGrads.cpp"
                   ,0x138);
      }
      if (1 < iVar13) {
        (*filteredFuncs->_vptr_TPZVec[3])
                  (filteredFuncs,(long)(int)(((uint)((iVar13 + 2) * (iVar13 + -1)) >> 1) + iVar18));
        iVar19 = iVar1;
        for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
          piVar9 = filteredFuncs->fStore;
          for (lVar7 = 0; iVar5 = (int)lVar7, iVar13 + -1 != iVar5; lVar7 = lVar7 + 1) {
            piVar9[iVar18 + lVar7] = iVar19 + iVar5;
          }
          iVar18 = iVar18 + iVar5;
          iVar19 = iVar19 + iVar13 + -1;
        }
        uVar11 = (iVar13 + -2) * (iVar13 + -1);
        piVar9 = filteredFuncs->fStore;
        uVar12 = 0;
        if ((int)uVar11 < 1) {
          uVar11 = 0;
        }
        for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
          if ((uVar12 & 1) != 0) {
            piVar9[iVar18] = iVar13 * 3 + iVar1 + -3 + uVar12;
            iVar18 = iVar18 + 1;
          }
        }
      }
    }
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::HighOrderFunctionsFilter(
  const TPZVec<int> &firstHCurlFunc,
  const TPZVec<int> &conOrders,
  TPZVec<int> &filteredFuncs){
  
  constexpr auto dim = TSHAPE::Dimension;
  constexpr auto nNodes = TSHAPE::NCornerNodes;
  constexpr auto nConnects = TSHAPE::NSides - nNodes;
  const auto nFaces = TSHAPE::NumSides(2);
  const auto nEdges = TSHAPE::NumSides(1);

  filteredFuncs.Resize(0);
  /*
    face connects: 
  */
  auto fcount = 0;
  for(auto iface = 0; iface < nFaces; iface++){
    const auto icon = nEdges + iface;
    const auto side = icon + nNodes;
    const auto firstSideShape = firstHCurlFunc[icon];
    const auto order = conOrders[icon];

    switch(TSHAPE::Type(side)){
    case ETriangle:{
      //there are no face functions for k < 2
      if(order < 2) break;
      /**
         we remove one internal function for each h1 face function of order k+1
         since there are (k-1)(k-2)/2 functions per face in a face with order k,
         we remove k(k-1)/2.
         so:
         (k-1)*(k+1)-k*(k-1)/2 = (k-1)(k+2)/2.
      */
      const auto nfacefuncs =  (order - 1) * (order+2) / 2;
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 3(k-1) vfe funcs.
         that means that, at each k, there are 3 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{3};
      for (auto ie = 0; ie < nedges - 1; ie++){
        const int nfuncs = order-1;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /**
         there are already 2(k-1) filtered functions. we discarded (k-1).
         so that means we need more (k-1)(k-2)/2 functions, because
         2(k-1) + (k-1)(k-2)/2 = (k-1)(k+2)/2. 
         That means we can take exactly half of the phi_fi functions. 
         for each k, there are 2(k-2) phi_fi func. so...
      **/
      auto firstVfiK = firstSideShape + 3*(order-1);
      const auto nPhiFi = (order-1)*(order-2);
      for(auto ifunc = 0; ifunc < nPhiFi; ifunc++){
        if(ifunc%2 == 0) continue;//we always skip one of them
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      break;
    }
    case EQuadrilateral:{
      /*
        from the 2k(k+1) functions, we filter out k^2 gradients of h1, thus
        there are k(k+2) remaining functions.
        from the 2k(k-1) phi_Fi functions, we can remove half of them,
        that sums k(k-1). so, we remove aditionally k phi_Fe functions of a given edge.
        k(k-1) + 3k = k(k+2) as we wanted.

        we need to take into account x- and y -dirs
      */
      const auto nfacefuncs =  order * (order+2);
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 4k vfe funcs.
         that means that, at each k, there are 4 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge, which
         is associated with the x direction
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{4};
      for (auto ie = 0; ie < nedges-1; ie++){
        const int nfuncs = order;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /*now we take half of the phi_fi functions.
        there are 2(k-1)(k-1) scalar functions that will be multiplied by
        vectors in both the x and y directions. we will skip all in the x dir.
        and then, 2*(k-1) functions that will be half in x dir and half in y dir.
        we also skip all in the x dir
       */
      auto firstVfiK = firstSideShape + 4*order;
      const auto nPhiFiK = 2*(order-1)*(order-1);
      const auto nPhiFiK1 = (order-1); // we will have nPhiFiK1 in x and nPhiFiK1 in y
      for(auto ifunc = 0; ifunc < nPhiFiK; ifunc++){
        if(ifunc%2==0) continue;//we always skip the one in x dir
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      //taking only the ones in the y-dir
      for(auto ifunc = 0; ifunc < nPhiFiK1; ifunc++){
        filteredFuncs[fcount] = firstVfiK+nPhiFiK+nPhiFiK1+ifunc;
        fcount++;
      }
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      break;
    }
    default:
      PZError<<__PRETTY_FUNCTION__<<" error. Not yet implemented"<<std::endl;
      DebugStop();
    }

  }
  
  if constexpr (dim < 3) return;

  if constexpr (TSHAPE::Type() == ETetraedro){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)(k-2)(k-3)/6 functions in a h1 element with order k,
       we remove k(k-1)(k-2)/6.
       so:
       (k-1)(k-2)(k+1)/2 - k(k-1)(k-2)/6 = (k-1)(k-2)(2k+3)/6.

       since we will remove k(k-1)(k-2)/6, for each  k   we remove (k-1)(k-2)/2 funcs.

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   k-1                 new funcs
       phi_kf      2(k-1)(k-2)         2(k-2)(k-3)         4(k-2)
       phi_ki      (k-1)(k-2)(k-3)/2   (k-2)(k-3)(k-4)/2   3(k-2)(k-3)/2
            
       that means that if we remove, for each k, (k-2) phi_kf 
       (for instance, all phi_kf associated with a given face),
       we need to remove (k-1)(k-2)/2 - (k-2) = (k-2)(k-3)/2
       which is exactly one third of the phi_ki.
            
    */

    const auto nintfuncs =  (order - 1) * (order-2) * (2*order+ 3) / 6;

    filteredFuncs.Resize(fcount+nintfuncs);

    /**
       we will iterate over the phi_kf hcurl functions.
       we chose to remove all the functions for a given face
       since they are sorted by face, we can simply skip (k-1)(k-2)/2 functions...
    */
    const auto firstvkf = firstSideShape;
    const auto offset = (order-1)*(order-2)/2;
    const auto nvkf = 2*(order-1)*(order-2);
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions
    */

    auto firstVki = firstSideShape + nvkf;
    for(auto ik = 4; ik <= order; ik++){
      //we chose to remove all the functions for a given direction
      const auto newvki = 3*(ik-2)*(ik-3)/2;
      for(auto ifunc = 0; ifunc < newvki; ifunc++){
        if(ifunc%3 == 0) continue;
        filteredFuncs[fcount] = firstVki+ifunc;
        fcount++;
      }
      //we skip to the higher order ones
      firstVki += newvki;
    }
  }
  else if constexpr (TSHAPE::Type() == ECube){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)^3 functions in a h1 element with order k,
       we remove k^3
       so:
       3k^2(k+1) - k^3 = k^2(2k+3)

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   
       phi_kf      6k^2
       phi_ki      3k^2(k-1)

       if we remove all phi_kf associated with a given face (k^2 funcs)
       and all phi_ki associated with a given direction (k^2(k-1)),
       we have removed all k^3 functions that we needed to.
    */

    const auto nintfuncs =  order*order*(2*order+3);

    filteredFuncs.Resize(fcount+nintfuncs);


    const auto firstvkf = firstSideShape;
    
    const auto offset = order*order;//we skip the first face, z direction
    const auto nvkf = 6*order*order;
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions. we have them separated:
       3(k-1)^3 functions of order k and 3(k-1)(2k-1) ( (k-1)(2k-1) in each direction).
       we will filter all funcs in z direction
    */

    const auto firstVki = firstSideShape + nvkf;
    const auto nvkik = 3*(order-1)*(order-1)*(order-1);
    const auto nvkik1 = (order-1)*(2*order-1);//for each direction
    
    for(auto ifunc = 0; ifunc < nvkik; ifunc++){
      if(ifunc%3 == 2) continue;//skip z direction
      filteredFuncs[fcount] = firstVki+ifunc;
      fcount++;
    }

    const auto firstxfunc = firstVki+nvkik;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//x dir
      filteredFuncs[fcount] = firstxfunc+ifunc;
      fcount++;
    }
    const auto firstyfunc = firstxfunc+nvkik1;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//y dir
      filteredFuncs[fcount] = firstyfunc+ifunc;
      fcount++;
    }
  }
}